

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

ostream * deqp::gles3::Functional::TransformFeedback::operator<<(ostream *str,DrawCall *call)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(str,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,call->numElements);
  poVar1 = std::operator<<(poVar1,", ");
  pcVar2 = "paused";
  if (call->transformFeedbackEnabled != false) {
    pcVar2 = "resumed";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const DrawCall& call)
{
	return str << "(" << call.numElements << ", " << (call.transformFeedbackEnabled ? "resumed" : "paused") << ")";
}